

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

CollSeq * sqlite3FindCollSeq(sqlite3 *db,u8 enc,char *zName,int create)

{
  HashElem *pHVar1;
  size_t sVar2;
  undefined8 *data;
  void *p;
  CollSeq *pCVar3;
  char *pKey;
  ulong uVar4;
  
  if (zName == (char *)0x0) {
    return db->pDfltColl;
  }
  pHVar1 = findElementWithHash(&db->aCollSeq,zName,(uint *)0x0);
  data = (undefined8 *)pHVar1->data;
  if (create != 0 && data == (undefined8 *)0x0) {
    sVar2 = strlen(zName);
    uVar4 = (ulong)((uint)sVar2 & 0x3fffffff);
    data = (undefined8 *)sqlite3DbMallocZero(db,uVar4 + 0x79);
    if (data != (undefined8 *)0x0) {
      pKey = (char *)(data + 0xf);
      *data = pKey;
      *(undefined1 *)(data + 1) = 1;
      data[5] = pKey;
      *(undefined1 *)(data + 6) = 2;
      data[10] = pKey;
      *(undefined1 *)(data + 0xb) = 3;
      memcpy(pKey,zName,uVar4 + 1);
      p = sqlite3HashInsert(&db->aCollSeq,pKey,data);
      if (p == (void *)0x0) goto LAB_0015be2a;
      sqlite3OomFault(db);
      sqlite3DbFreeNN(db,p);
    }
    data = (undefined8 *)0x0;
  }
LAB_0015be2a:
  if (data == (undefined8 *)0x0) {
    pCVar3 = (CollSeq *)0x0;
  }
  else {
    pCVar3 = (CollSeq *)(data + (ulong)enc * 5 + -5);
  }
  return pCVar3;
}

Assistant:

SQLITE_PRIVATE CollSeq *sqlite3FindCollSeq(
  sqlite3 *db,          /* Database connection to search */
  u8 enc,               /* Desired text encoding */
  const char *zName,    /* Name of the collating sequence.  Might be NULL */
  int create            /* True to create CollSeq if doesn't already exist */
){
  CollSeq *pColl;
  assert( SQLITE_UTF8==1 && SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
  assert( enc>=SQLITE_UTF8 && enc<=SQLITE_UTF16BE );
  if( zName ){
    pColl = findCollSeqEntry(db, zName, create);
    if( pColl ) pColl += enc-1;
  }else{
    pColl = db->pDfltColl;
  }
  return pColl;
}